

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ExampleSOLHandler esolh;
  ExampleNLFeeder nlf;
  string stub;
  string local_348;
  string sopts;
  string solver;
  NLUtils utils;
  NLSolver nlsol;
  ExampleModel emdl;
  
  if (1 < argc) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&solver,argv[1],(allocator<char> *)&emdl);
    if (argc == 2) {
      pcVar3 = "";
    }
    else {
      pcVar3 = argv[2];
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sopts,pcVar3,(allocator<char> *)&emdl);
    if ((uint)argc < 4) {
      pcVar3 = "";
      nlf.binary_ = true;
    }
    else {
      iVar2 = strcmp("text",argv[3]);
      nlf.binary_ = iVar2 != 0;
      if (argc == 4) {
        pcVar3 = "";
      }
      else {
        pcVar3 = argv[4];
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stub,pcVar3,(allocator<char> *)&emdl);
    ExampleModel::ExampleModel(&emdl);
    utils._vptr_NLUtils = (_func_int **)&PTR__NLUtils_00123c40;
    utils.show_fln_ = false;
    esolh.mdl_ = &emdl;
    nlf.mdl_ = &emdl;
    mp::NLSolver::NLSolver(&nlsol,&utils);
    std::__cxx11::string::string((string *)&local_348,(string *)&stub);
    mp::NLSolver::SetFileStub(&nlsol,&local_348);
    std::__cxx11::string::~string((string *)&local_348);
    bVar1 = mp::NLSolver::Solve<ExampleNLFeeder,ExampleSOLHandler>
                      (&nlsol,&nlf,&esolh,&solver,&sopts);
    if (!bVar1) {
      puts(nlsol.err_msg_._M_dataplus._M_p);
    }
    else {
      ExampleSOLHandler::PrintSolution(&esolh,&stub);
    }
    mp::NLSolver::~NLSolver(&nlsol);
    ExampleModel::~ExampleModel(&emdl);
    std::__cxx11::string::~string((string *)&stub);
    std::__cxx11::string::~string((string *)&sopts);
    std::__cxx11::string::~string((string *)&solver);
    return (uint)!bVar1;
  }
  puts(
      "AMPL NL writer example.\nUsage:\n  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\nwhere <solver> is ipopt, gurobi, minos, ...;\nbinary/text is the NL format (default: binary.)\nExamples:\n  <this_exe> ipopt \"\" text /tmp/stub\n  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\""
      );
  exit(0);
}

Assistant:

int main(int argc, const char* const* argv) {
  if (argc<2) {
    printf("%s\n",
           "AMPL NL writer example.\n"
           "Usage:\n"
           "  <this_exe> <solver> [\"<solver_options>\" [binary/text [<stub>]]],\n\n"
           "where <solver> is ipopt, gurobi, minos, ...;\n"
           "binary/text is the NL format (default: binary.)\n"
           "Examples:\n"
           "  <this_exe> ipopt \"\" text /tmp/stub\n"
           "  <this_exe> gurobi \"nonconvex=2 funcpieces=-2 funcpieceratio=1e-4\"");
    exit(0);
  }
  std::string solver = (argc>1) ? argv[1] : "minos";
  std::string sopts = (argc>2) ? argv[2] : "";
  bool binary = (argc<=3) || std::strcmp("text", argv[3]);
  std::string stub = (argc>4) ? argv[4] : "";

  ExampleModel emdl;
  ExampleNLFeeder nlf(emdl, binary);
  ExampleSOLHandler esolh(emdl);
  mp::NLUtils utils;

  mp::NLSolver nlsol(&utils);
  nlsol.SetFileStub(stub);
  if (!nlsol.Solve(nlf, esolh, solver, sopts)) {
    printf("%s\n", nlsol.GetErrorMessage());
    return EXIT_FAILURE;
  } else {
    esolh.PrintSolution(stub);
  }

  return EXIT_SUCCESS;
}